

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O2

Abc_Cex_t * Bmc_CexCareTotal(Abc_Cex_t **pCexes,int nCexes)

{
  Abc_Cex_t *pAVar1;
  int iVar2;
  Abc_Cex_t *pAVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  pAVar1 = *pCexes;
  uVar6 = ((pAVar1->nBits >> 5) + 1) - (uint)((pAVar1->nBits & 0x1fU) == 0);
  pAVar3 = Abc_CexAlloc(pAVar1->nRegs,pAVar1->nPis,pAVar1->iFrame + 1);
  pAVar1 = *pCexes;
  iVar2 = pAVar1->iFrame;
  pAVar3->iPo = pAVar1->iPo;
  pAVar3->iFrame = iVar2;
  uVar4 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar4;
  }
  for (; uVar4 != uVar7; uVar4 = uVar4 + 1) {
    uVar6 = (&pAVar1[1].iPo)[uVar4];
    (&pAVar3[1].iPo)[uVar4] = uVar6;
    for (lVar5 = 1; lVar5 < nCexes; lVar5 = lVar5 + 1) {
      uVar6 = uVar6 & (&pCexes[lVar5][1].iPo)[uVar4];
      (&pAVar3[1].iPo)[uVar4] = uVar6;
    }
  }
  return pAVar3;
}

Assistant:

Abc_Cex_t * Bmc_CexCareTotal( Abc_Cex_t ** pCexes, int nCexes )
{
    int i, k, nWords = Abc_BitWordNum( pCexes[0]->nBits );
    Abc_Cex_t * pCexMin = Abc_CexAlloc( pCexes[0]->nRegs, pCexes[0]->nPis, pCexes[0]->iFrame + 1 );
    pCexMin->iPo    = pCexes[0]->iPo;
    pCexMin->iFrame = pCexes[0]->iFrame;
    for ( i = 0; i < nWords; i++ )
    {
        pCexMin->pData[i] = pCexes[0]->pData[i];
        for ( k = 1; k < nCexes; k++ )
            pCexMin->pData[i] &= pCexes[k]->pData[i];
    }
    return pCexMin;
}